

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall pbrt::ParameterDictionary::checkParameterTypes(ParameterDictionary *this)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int iVar3;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar4;
  long lVar5;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar4 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar4 = paVar1;
  }
  if (sVar2 != 0) {
    lVar5 = 0;
    do {
      args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)paVar4 + lVar5);
      iVar3 = std::__cxx11::string::compare((char *)args);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)args);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)args);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)args);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)args);
              if (iVar3 != 0) {
                iVar3 = std::__cxx11::string::compare((char *)args);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare((char *)args);
                  if (iVar3 != 0) {
                    iVar3 = std::__cxx11::string::compare((char *)args);
                    if (iVar3 != 0) {
                      iVar3 = std::__cxx11::string::compare((char *)args);
                      if (iVar3 != 0) {
                        iVar3 = std::__cxx11::string::compare((char *)args);
                        if (iVar3 != 0) {
                          iVar3 = std::__cxx11::string::compare((char *)args);
                          if (iVar3 != 0) {
                            iVar3 = std::__cxx11::string::compare((char *)args);
                            if (iVar3 != 0) {
                              iVar3 = std::__cxx11::string::compare((char *)args);
                              if (iVar3 != 0) {
                                ErrorExit<std::__cxx11::string_const&>
                                          ((FileLoc *)(args + 2),"%s: unknown parameter type",args);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      lVar5 = lVar5 + 8;
    } while (sVar2 << 3 != lVar5);
  }
  return;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}